

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiColumnsFlags flags)

{
  float fVar1;
  ImVec2 IVar2;
  ImGuiWindow *pIVar3;
  ImGuiColumns *pIVar4;
  ImGuiColumnData *pIVar5;
  ImGuiColumnsFlags in_EDX;
  int in_ESI;
  float fVar6;
  float fVar7;
  float x2;
  float fVar8;
  float y1;
  float fVar9;
  float width;
  float offset_1;
  float offset_0;
  float clip_x2;
  float clip_x1;
  ImGuiColumnData *column_1;
  int n_1;
  ImGuiColumnData column;
  int n;
  float max_2;
  float max_1;
  float half_clip_extend_x;
  float column_padding;
  ImGuiColumns *columns;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  float local_88;
  float in_stack_ffffffffffffff7c;
  ImVec2 in_stack_ffffffffffffff80;
  int local_64;
  int local_44;
  ImGuiContext *window_00;
  
  window_00 = GImGui;
  pIVar3 = GetCurrentWindow();
  GetColumnsID((char *)in_stack_ffffffffffffff80,(int)in_stack_ffffffffffffff7c);
  pIVar4 = FindOrCreateColumns((ImGuiWindow *)window_00,(ImGuiID)((ulong)pIVar3 >> 0x20));
  pIVar4->Current = 0;
  pIVar4->Count = in_ESI;
  pIVar4->Flags = in_EDX;
  (pIVar3->DC).CurrentColumns = pIVar4;
  pIVar4->HostCursorPosY = (pIVar3->DC).CursorPos.y;
  pIVar4->HostCursorMaxPosX = (pIVar3->DC).CursorMaxPos.x;
  (pIVar4->HostClipRect).Min = (pIVar3->ClipRect).Min;
  (pIVar4->HostClipRect).Max = (pIVar3->ClipRect).Max;
  (pIVar4->HostWorkRect).Min = (pIVar3->WorkRect).Min;
  (pIVar4->HostWorkRect).Max = (pIVar3->WorkRect).Max;
  fVar1 = (window_00->Style).ItemSpacing.x;
  fVar6 = ImMax<float>((pIVar3->WindowPadding).x * 0.5,pIVar3->WindowBorderSize);
  fVar7 = ImFloor(fVar6);
  x2 = (pIVar3->WorkRect).Max.x + fVar1;
  fVar8 = ImMax<float>(fVar1 - (pIVar3->WindowPadding).x,0.0);
  fVar8 = x2 - fVar8;
  fVar6 = (pIVar3->WorkRect).Max.x;
  y1 = (pIVar3->DC).Indent.x - fVar1;
  fVar9 = ImMax<float>(fVar1 - (pIVar3->WindowPadding).x,0.0);
  pIVar4->OffMinX = y1 + fVar9;
  fVar6 = ImMin<float>(fVar8,fVar6 + fVar7);
  fVar6 = ImMax<float>(fVar6 - (pIVar3->Pos).x,pIVar4->OffMinX + 1.0);
  pIVar4->OffMaxX = fVar6;
  fVar6 = (pIVar3->DC).CursorPos.y;
  pIVar4->LineMaxY = fVar6;
  pIVar4->LineMinY = fVar6;
  if (((pIVar4->Columns).Size != 0) && ((pIVar4->Columns).Size != in_ESI + 1)) {
    ImVector<ImGuiColumnData>::resize
              ((ImVector<ImGuiColumnData> *)CONCAT44(x2,in_stack_ffffffffffffff60),
               (int)in_stack_ffffffffffffff5c);
  }
  pIVar4->IsFirstFrame = (pIVar4->Columns).Size == 0;
  if ((pIVar4->Columns).Size == 0) {
    ImVector<ImGuiColumnData>::reserve
              ((ImVector<ImGuiColumnData> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (int)in_stack_ffffffffffffff6c);
    for (local_44 = 0; local_44 < in_ESI + 1; local_44 = local_44 + 1) {
      ImGuiColumnData::ImGuiColumnData((ImGuiColumnData *)CONCAT44(x2,in_stack_ffffffffffffff60));
      ImVector<ImGuiColumnData>::push_back
                ((ImVector<ImGuiColumnData> *)CONCAT44(x2,in_stack_ffffffffffffff60),
                 (ImGuiColumnData *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
  }
  for (local_64 = 0; local_64 < in_ESI; local_64 = local_64 + 1) {
    pIVar5 = ImVector<ImGuiColumnData>::operator[](&pIVar4->Columns,local_64);
    in_stack_ffffffffffffff5c = (pIVar3->Pos).x;
    GetColumnOffset(in_stack_ffffffffffffff70);
    in_stack_ffffffffffffff60 = (pIVar3->Pos).x;
    GetColumnOffset(in_stack_ffffffffffffff70);
    ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff6c,y1,x2,in_stack_ffffffffffffff60);
    IVar2.y = in_stack_ffffffffffffff7c;
    IVar2.x = local_88;
    (pIVar5->ClipRect).Min = IVar2;
    (pIVar5->ClipRect).Max = in_stack_ffffffffffffff80;
    ImRect::ClipWith((ImRect *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (ImRect *)CONCAT44(in_stack_ffffffffffffff6c,y1));
  }
  if (1 < pIVar4->Count) {
    ImDrawList::ChannelsSplit
              ((ImDrawList *)CONCAT44(x2,in_stack_ffffffffffffff60),(int)in_stack_ffffffffffffff5c);
    ImDrawList::ChannelsSetCurrent
              ((ImDrawList *)CONCAT44(x2,in_stack_ffffffffffffff60),(int)in_stack_ffffffffffffff5c);
    PushColumnClipRect(in_stack_ffffffffffffff74);
  }
  fVar6 = GetColumnOffset(in_stack_ffffffffffffff70);
  fVar7 = GetColumnOffset(in_stack_ffffffffffffff70);
  PushItemWidth(fVar6);
  fVar6 = ImMax<float>(fVar1 - (pIVar3->WindowPadding).x,0.0);
  (pIVar3->DC).ColumnsOffset.x = fVar6;
  (pIVar3->DC).CursorPos.x =
       (float)(int)((pIVar3->Pos).x + (pIVar3->DC).Indent.x + (pIVar3->DC).ColumnsOffset.x);
  (pIVar3->WorkRect).Max.x = ((pIVar3->Pos).x + fVar7) - fVar1;
  return;
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiColumnsFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count >= 1 && columns_count <= 64);   // Maximum 64 columns
    IM_ASSERT(window->DC.CurrentColumns == NULL);           // Nested columns are currently not supported

    // Acquire storage for the columns set
    ImGuiID id = GetColumnsID(str_id, columns_count);
    ImGuiColumns* columns = FindOrCreateColumns(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.CurrentColumns = columns;

    columns->HostCursorPosY = window->DC.CursorPos.y;
    columns->HostCursorMaxPosX = window->DC.CursorMaxPos.x;
    columns->HostClipRect = window->ClipRect;
    columns->HostWorkRect = window->WorkRect;

    // Set state for first column
    // We aim so that the right-most column will have the same clipping width as other after being clipped by parent ClipRect
    const float column_padding = g.Style.ItemSpacing.x;
    const float half_clip_extend_x = ImFloor(ImMax(window->WindowPadding.x * 0.5f, window->WindowBorderSize));
    const float max_1 = window->WorkRect.Max.x + column_padding - ImMax(column_padding - window->WindowPadding.x, 0.0f);
    const float max_2 = window->WorkRect.Max.x + half_clip_extend_x;
    columns->OffMinX = window->DC.Indent.x - column_padding + ImMax(column_padding - window->WindowPadding.x, 0.0f);
    columns->OffMaxX = ImMax(ImMin(max_1, max_2) - window->Pos.x, columns->OffMinX + 1.0f);
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize default widths
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiColumnData* column = &columns->Columns[n];
        float clip_x1 = IM_ROUND(window->Pos.x + GetColumnOffset(n));
        float clip_x2 = IM_ROUND(window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWith(window->ClipRect);
    }

    if (columns->Count > 1)
    {
        window->DrawList->ChannelsSplit(1 + columns->Count);
        window->DrawList->ChannelsSetCurrent(1);
        PushColumnClipRect(0);
    }

    // We don't generally store Indent.x inside ColumnsOffset because it may be manipulated by the user.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}